

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDec.c
# Opt level: O0

void Abc_TtStoreTest(char *pFileName)

{
  Abc_TtStore_t *p_00;
  char *pFileOutput;
  char *pFileInput;
  Abc_TtStore_t *p;
  char *pFileName_local;
  
  p_00 = Abc_TtStoreLoad(pFileName,-1);
  if (p_00 != (Abc_TtStore_t *)0x0) {
    Abc_TtStoreWrite("out.txt",p_00,0);
    Abc_TtStoreFree(p_00,-1);
    printf("Input file \"%s\" was copied into output file \"%s\".\n",pFileName,"out.txt");
  }
  return;
}

Assistant:

void Abc_TtStoreTest( char * pFileName )
{ 
    Abc_TtStore_t * p;
    char * pFileInput  = pFileName;
    char * pFileOutput = "out.txt";

    // read info from file
    p = Abc_TtStoreLoad( pFileInput, -1 );
    if ( p == NULL )
        return;

    // write into another file
    Abc_TtStoreWrite( pFileOutput, p, 0 );

    // delete data-structure
    Abc_TtStoreFree( p, -1 );
    printf( "Input file \"%s\" was copied into output file \"%s\".\n", pFileInput, pFileOutput );
}